

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O0

void __thiscall
docs::DocsParser::error<char_const(&)[35],char_const*>
          (DocsParser *this,char (*args) [35],char **args_1)

{
  undefined8 uVar1;
  char local_1028 [8];
  char buf [4096];
  char **args_local_1;
  char (*args_local) [35];
  DocsParser *this_local;
  
  sprintf(local_1028,*args,*args_1);
  uVar1 = std::__cxx11::string::c_str();
  printf("%s:%d:%d: %s\n",uVar1,(ulong)(uint)(this->tok).pos.line,(ulong)(uint)(this->tok).pos.col,
         local_1028);
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    std::printf("%s:%d:%d: %s\n",
                data.fn.c_str(),
                tok.pos.line,
                tok.pos.col,
                buf);
    std::exit(1);
  }